

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.h
# Opt level: O2

ScientificMatcher * __thiscall
icu_63::numparse::impl::ScientificMatcher::operator=
          (ScientificMatcher *this,ScientificMatcher *param_1)

{
  UnicodeString::moveFrom(&this->fExponentSeparatorString,&param_1->fExponentSeparatorString);
  DecimalMatcher::operator=(&this->fExponentMatcher,&param_1->fExponentMatcher);
  UnicodeString::moveFrom(&this->fCustomMinusSign,&param_1->fCustomMinusSign);
  UnicodeString::moveFrom(&this->fCustomPlusSign,&param_1->fCustomPlusSign);
  return this;
}

Assistant:

ScientificMatcher() = default;